

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ErrorExpected
          (WastParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *expected,char *example)

{
  Location loc;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  string local_f8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_c0;
  ulong local_b0;
  size_t i;
  string local_98 [8];
  string expected_str;
  Token token;
  char *example_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *expected_local;
  WastParser *this_local;
  
  Consume((Token *)((long)&expected_str.field_2 + 8),this);
  std::__cxx11::string::string(local_98);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(expected);
  if (!bVar3) {
    std::__cxx11::string::operator=(local_98,", expected ");
    for (local_b0 = 0; uVar1 = local_b0,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(expected), uVar2 = local_b0, uVar1 < sVar4; local_b0 = local_b0 + 1) {
      if (local_b0 != 0) {
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(expected);
        if (uVar2 == sVar4 - 1) {
          std::__cxx11::string::operator+=(local_98," or ");
        }
        else {
          std::__cxx11::string::operator+=(local_98,", ");
        }
      }
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](expected,local_b0);
      std::__cxx11::string::operator+=(local_98,(string *)pvVar5);
    }
    if (example != (char *)0x0) {
      std::__cxx11::string::operator+=(local_98," (e.g. ");
      std::__cxx11::string::operator+=(local_98,example);
      std::__cxx11::string::operator+=(local_98,")");
    }
  }
  local_c8 = token.loc.filename.size_;
  aStack_c0.offset = (size_t)token.loc.field_1.field_1.offset;
  local_d8 = expected_str.field_2._8_8_;
  uStack_d0 = token.loc.filename.data_;
  Token::to_string_clamp_abi_cxx11_(&local_f8,(Token *)((long)&expected_str.field_2 + 8),0x50);
  uVar6 = std::__cxx11::string::c_str((string *)&local_f8);
  uVar7 = std::__cxx11::string::c_str(local_98);
  loc.filename.size_._0_4_ = (undefined4)uStack_d0;
  loc.filename.data_ = (char *)local_d8;
  loc.filename.size_._4_4_ = uStack_d0._4_4_;
  loc.field_1.field_0.line = (undefined4)local_c8;
  loc.field_1.field_0.first_column = local_c8._4_4_;
  loc.field_1.field_0.last_column = (undefined4)aStack_c0.offset;
  loc.field_1._12_4_ = aStack_c0.offset._4_4_;
  Error(this,loc,"unexpected token \"%s\"%s.",uVar6,uVar7,in_R8,in_R9);
  std::__cxx11::string::~string((string *)&local_f8);
  Result::Result((Result *)((long)&this_local + 4),Error);
  std::__cxx11::string::~string(local_98);
  Token::~Token((Token *)((long)&expected_str.field_2 + 8));
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ErrorExpected(const std::vector<std::string>& expected,
                                 const char* example) {
  Token token = Consume();
  std::string expected_str;
  if (!expected.empty()) {
    expected_str = ", expected ";
    for (size_t i = 0; i < expected.size(); ++i) {
      if (i != 0) {
        if (i == expected.size() - 1) {
          expected_str += " or ";
        } else {
          expected_str += ", ";
        }
      }

      expected_str += expected[i];
    }

    if (example) {
      expected_str += " (e.g. ";
      expected_str += example;
      expected_str += ")";
    }
  }

  Error(token.loc, "unexpected token \"%s\"%s.",
        token.to_string_clamp(kMaxErrorTokenLength).c_str(),
        expected_str.c_str());
  return Result::Error;
}